

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall QTextDocumentPrivate::clear(QTextDocumentPrivate *this)

{
  bool bVar1;
  int iVar2;
  QTextCursorPrivate **ppQVar3;
  QTextObject **ppQVar4;
  EVP_PKEY_CTX *ctx;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int len;
  QTextCursorPrivate *curs;
  add_const_t<QSet<QTextCursorPrivate_*>_> *__range1;
  QTextDocument *q;
  Iterator objectIt;
  QSet<QTextCursorPrivate_*> oldCursors;
  const_iterator __end1;
  const_iterator __begin1;
  QScopedValueRollback<bool> bg;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  QTextFormatCollection *in_stack_ffffffffffffff40;
  QScopedValueRollback<bool> *this_00;
  QMap<int,_QTextObject_*> *in_stack_ffffffffffffff48;
  QTextObject *in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff68;
  QTextDocumentPrivate *pQVar5;
  QTextDocumentPrivate *in_stack_ffffffffffffff88;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  q_func(in_RDI);
  QSet<QTextCursorPrivate_*>::begin((QSet<QTextCursorPrivate_*> *)in_RDI);
  QSet<QTextCursorPrivate_*>::end((QSet<QTextCursorPrivate_*> *)in_RDI);
  while (bVar1 = QSet<QTextCursorPrivate_*>::const_iterator::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff40,
                            (const_iterator *)
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)), bVar1) {
    ppQVar3 = QSet<QTextCursorPrivate_*>::const_iterator::operator*((const_iterator *)0x7d09af);
    in_stack_ffffffffffffff68._M_node = (_Base_ptr)*ppQVar3;
    QTextCursorPrivate::setPosition((QTextCursorPrivate *)in_stack_ffffffffffffff68._M_node,0);
    ((QTextCursorPrivate *)in_stack_ffffffffffffff68._M_node)->currentCharFormat = -1;
    ((QTextCursorPrivate *)in_stack_ffffffffffffff68._M_node)->anchor = 0;
    ((QTextCursorPrivate *)in_stack_ffffffffffffff68._M_node)->adjusted_anchor = 0;
    QSet<QTextCursorPrivate_*>::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff40);
  }
  QSet<QTextCursorPrivate_*>::QSet
            ((QSet<QTextCursorPrivate_*> *)in_stack_ffffffffffffff40,
             (QSet<QTextCursorPrivate_*> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QSet<QTextCursorPrivate_*>::clear((QSet<QTextCursorPrivate_*> *)0x7d0a2f);
  QMap<int,_QTextObject_*>::begin((QMap<int,_QTextObject_*> *)in_stack_ffffffffffffff50);
  while( true ) {
    QMap<int,_QTextObject_*>::end((QMap<int,_QTextObject_*> *)in_stack_ffffffffffffff50);
    bVar1 = ::operator!=((iterator *)in_stack_ffffffffffffff40,
                         (iterator *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar1) break;
    ppQVar4 = QMap<int,_QTextObject_*>::iterator::operator*((iterator *)0x7d0a95);
    if (*ppQVar4 == &in_RDI->rtFrame->super_QTextObject) {
      QMap<int,_QTextObject_*>::iterator::operator++((iterator *)in_stack_ffffffffffffff40);
    }
    else {
      ppQVar4 = QMap<int,_QTextObject_*>::iterator::operator*((iterator *)0x7d0ab3);
      in_stack_ffffffffffffff50 = *ppQVar4;
      if (in_stack_ffffffffffffff50 != (QTextObject *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffff50 + 0x20))();
      }
      in_stack_ffffffffffffff48 = &in_RDI->objects;
      QMap<int,_QTextObject_*>::const_iterator::const_iterator
                ((const_iterator *)in_stack_ffffffffffffff40,
                 (iterator *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QMap<int,_QTextObject_*>::erase
                (in_stack_ffffffffffffff48,(const_iterator)in_stack_ffffffffffffff68._M_node);
    }
  }
  QMap<int,_QTextObject_*>::clear((QMap<int,_QTextObject_*> *)in_stack_ffffffffffffff40);
  QString::clear((QString *)in_stack_ffffffffffffff40);
  clearUndoRedoStacks(in_stack_ffffffffffffff88,(Stacks)((ulong)pQVar5 >> 0x20),
                      SUB81((ulong)pQVar5 >> 0x18,0));
  QString::QString((QString *)0x7d0b60);
  QString::operator=((QString *)in_stack_ffffffffffffff40,
                     (QString *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QString::~QString((QString *)0x7d0b80);
  in_RDI->unreachableCharacterCount = 0;
  in_RDI->modifiedState = 0;
  in_RDI->modified = false;
  QTextFormatCollection::clear(in_stack_ffffffffffffff40);
  ctx = (EVP_PKEY_CTX *)0x0;
  iVar2 = QFragmentMap<QTextFragmentData>::length
                    ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffff40,
                     in_stack_ffffffffffffff3c);
  QFragmentMap<QTextFragmentData>::clear
            ((QFragmentMap<QTextFragmentData> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QFragmentMap<QTextBlockData>::clear
            ((QFragmentMap<QTextBlockData> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  QMap<QUrl,_QVariant>::clear((QMap<QUrl,_QVariant> *)in_stack_ffffffffffffff40);
  this_00 = (QScopedValueRollback<bool> *)in_RDI->rtFrame;
  if (this_00 != (QScopedValueRollback<bool> *)0x0) {
    (**(code **)(*(long *)&this_00->varRef + 0x20))();
  }
  in_RDI->rtFrame = (QTextFrame *)0x0;
  init(in_RDI,ctx);
  QSet<QTextCursorPrivate_*>::operator=
            ((QSet<QTextCursorPrivate_*> *)this_00,
             (QSet<QTextCursorPrivate_*> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QScopedValueRollback<bool>::QScopedValueRollback
            (this_00,(bool *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  QTextDocument::contentsChange
            ((QTextDocument *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48,
             (int)((ulong)this_00 >> 0x20));
  QScopedValueRollback<bool>::~QScopedValueRollback((QScopedValueRollback<bool> *)local_18);
  if (in_RDI->lout != (QAbstractTextDocumentLayout *)0x0) {
    (**(code **)(*(long *)in_RDI->lout + 0x90))(in_RDI->lout,0,iVar2);
  }
  QSet<QTextCursorPrivate_*>::~QSet((QSet<QTextCursorPrivate_*> *)0x7d0cda);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clear()
{
    Q_Q(QTextDocument);

    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        curs->setPosition(0);
        curs->currentCharFormat = -1;
        curs->anchor = 0;
        curs->adjusted_anchor = 0;
    }

    QSet<QTextCursorPrivate *> oldCursors = cursors;
    QT_TRY{
        cursors.clear();

        QMap<int, QTextObject *>::Iterator objectIt = objects.begin();
        while (objectIt != objects.end()) {
            if (*objectIt != rtFrame) {
                delete *objectIt;
                objectIt = objects.erase(objectIt);
            } else {
                ++objectIt;
            }
        }
        // also clear out the remaining root frame pointer
        // (we're going to delete the object further down)
        objects.clear();

        title.clear();
        clearUndoRedoStacks(QTextDocument::UndoAndRedoStacks);
        text = QString();
        unreachableCharacterCount = 0;
        modifiedState = 0;
        modified = false;
        formats.clear();
        int len = fragments.length();
        fragments.clear();
        blocks.clear();
        cachedResources.clear();
        delete rtFrame;
        rtFrame = nullptr;
        init();
        cursors = oldCursors;
        {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(0, len, 0);
        }
        if (lout)
            lout->documentChanged(0, len, 0);
    }